

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t UA_calcSizeBinary(void *p,UA_DataType *type)

{
  byte bVar1;
  UA_DataTypeMember *pUVar2;
  UA_DataType *type_00;
  void *pvVar3;
  size_t sVar4;
  uint local_74;
  size_t length;
  size_t encode_index;
  UA_DataType *membertype;
  UA_DataTypeMember *member;
  size_t i;
  UA_DataType *typelists [2];
  size_t *psStack_28;
  UA_Byte membersSize;
  uintptr_t ptr;
  size_t s;
  UA_DataType *type_local;
  void *p_local;
  
  ptr = 0;
  bVar1 = type->membersSize;
  typelists[0] = type + (int)-(uint)type->typeIndex;
  psStack_28 = (size_t *)p;
  for (member = (UA_DataTypeMember *)0x0; member < (UA_DataTypeMember *)(ulong)bVar1;
      member = (UA_DataTypeMember *)((long)&member->memberName + 1)) {
    pUVar2 = type->members;
    type_00 = typelists[(long)(int)(uint)((pUVar2[(long)member].field_0xb & 1 ^ 0xff) & 1) + -1] +
              pUVar2[(long)member].memberTypeIndex;
    if (((byte)pUVar2[(long)member].field_0xb >> 1 & 1) == 0) {
      pvVar3 = (void *)((ulong)pUVar2[(long)member].padding + (long)psStack_28);
      if ((type_00->field_0x25 & 1) == 0) {
        local_74 = 0x19;
      }
      else {
        local_74 = (uint)type_00->typeIndex;
      }
      sVar4 = (*calcSizeBinaryJumpTable[local_74])(pvVar3,type_00);
      psStack_28 = (size_t *)((ulong)type_00->memSize + (long)pvVar3);
    }
    else {
      psStack_28 = (size_t *)((ulong)pUVar2[(long)member].padding + (long)psStack_28);
      sVar4 = Array_calcSizeBinary((void *)psStack_28[1],*psStack_28,type_00);
      psStack_28 = psStack_28 + 2;
    }
    ptr = sVar4 + ptr;
  }
  return ptr;
}

Assistant:

size_t
UA_calcSizeBinary(void *p, const UA_DataType *type) {
    size_t s = 0;
    uintptr_t ptr = (uintptr_t)p;
    UA_Byte membersSize = type->membersSize;
    const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *member = &type->members[i];
        const UA_DataType *membertype = &typelists[!member->namespaceZero][member->memberTypeIndex];
        if(!member->isArray) {
            ptr += member->padding;
            size_t encode_index = membertype->builtin ? membertype->typeIndex : UA_BUILTIN_TYPES_COUNT;
            s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, membertype);
            ptr += membertype->memSize;
        } else {
            ptr += member->padding;
            const size_t length = *((const size_t*)ptr);
            ptr += sizeof(size_t);
            s += Array_calcSizeBinary(*(void *UA_RESTRICT const *)ptr, length, membertype);
            ptr += sizeof(void*);
        }
    }
    return s;
}